

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O0

double __thiscall merlin::factor::distance(factor *this,factor *F2,Distance type)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  Type TVar5;
  int iVar6;
  variable_set *this_00;
  variable_set *B;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  factor *B_00;
  size_t sVar7;
  value *pvVar8;
  double *pdVar9;
  runtime_error *this_01;
  double __x;
  double __x_00;
  double __x_01;
  value vVar10;
  double __x_02;
  value vVar11;
  value local_148;
  ulong local_140;
  size_t i;
  double gap2;
  double gap1;
  double mx2;
  double mx1;
  value local_110;
  value local_108;
  value Z;
  double dist;
  undefined1 local_e8 [8];
  factor Ftmp;
  factor F;
  factor *F2_local;
  factor *this_local;
  double dStack_10;
  Distance type_local;
  
  this_local._4_4_ = type.t_;
  this_00 = vars(this);
  B = vars(F2);
  bVar4 = variable_set::operator==(this_00,B);
  if (!bVar4) {
    __assert_fail("vars() == F2.vars()",
                  "/workspace/llm4binary/github/license_c_cmakelists/radum2275[P]merlin/include/factor.h"
                  ,0x4c7,"double merlin::factor::distance(const factor &, Distance) const");
  }
  factor((factor *)&Ftmp.c_,this);
  factor((factor *)local_e8,1.0);
  Z = -1.0;
  TVar5 = Distance::operator_cast_to_Type((Distance *)((long)&this_local + 4));
  switch(TVar5) {
  case L1:
    operator-=((factor *)&Ftmp.c_,F2);
    iVar6 = abs((factor *)&Ftmp.c_,(int)F2);
    Z = sum((factor *)CONCAT44(extraout_var,iVar6));
    break;
  case L2:
    operator-=((factor *)&Ftmp.c_,F2);
    operator*=((factor *)&Ftmp.c_,(factor *)&Ftmp.c_);
    Z = sum((factor *)&Ftmp.c_);
    break;
  case LInf:
    operator-=((factor *)&Ftmp.c_,F2);
    iVar6 = abs((factor *)&Ftmp.c_,(int)F2);
    Z = max((factor *)CONCAT44(extraout_var_00,iVar6));
    break;
  case KL:
    local_108 = sum(this);
    operator/=((factor *)&Ftmp.c_,F2);
    vVar11 = sum(F2);
    operator*=((factor *)&Ftmp.c_,vVar11 / local_108);
    log((factor *)&Ftmp.c_,__x_00);
    operator*=((factor *)&Ftmp.c_,this);
    vVar11 = sum((factor *)&Ftmp.c_);
    Z = vVar11 / local_108;
    break;
  case HPM:
    operator/=((factor *)&Ftmp.c_,F2);
    log((factor *)&Ftmp.c_,__x_01);
    vVar11 = max((factor *)&Ftmp.c_);
    vVar10 = min((factor *)&Ftmp.c_);
    Z = vVar11 - vVar10;
    break;
  case MAS:
    log((factor *)&Ftmp.c_,__x);
    operator=((factor *)local_e8,F2);
    log((factor *)local_e8,__x_02);
    operator/=((factor *)&Ftmp.c_,B_00);
    local_110 = max((factor *)&Ftmp.c_);
    vVar11 = min((factor *)&Ftmp.c_);
    mx1 = 1.0 / vVar11;
    pdVar9 = std::max<double>(&local_110,&mx1);
    Z = *pdVar9 - 1.0;
    break;
  case OptGap:
    i = 0;
    gap2 = 0.0;
    gap1 = 0.0;
    mx2 = 0.0;
    for (local_140 = 0; uVar1 = local_140, sVar7 = num_states(this), dVar2 = mx2, uVar1 < sVar7;
        local_140 = local_140 + 1) {
      pvVar8 = operator[]((factor *)&Ftmp.c_,local_140);
      dVar3 = mx2;
      if (*pvVar8 <= dVar2) {
        pvVar8 = operator[]((factor *)&Ftmp.c_,local_140);
        if ((dVar3 == *pvVar8) && (!NAN(dVar3) && !NAN(*pvVar8))) {
          local_148 = operator[](F2,local_140);
          pdVar9 = std::min<double>((double *)&i,&local_148);
          i = (size_t)*pdVar9;
        }
      }
      else {
        i = (size_t)operator[](F2,local_140);
        pvVar8 = operator[]((factor *)&Ftmp.c_,local_140);
        mx2 = *pvVar8;
      }
      dVar2 = gap1;
      vVar11 = operator[](F2,local_140);
      dVar3 = gap1;
      if (vVar11 <= dVar2) {
        vVar11 = operator[](F2,local_140);
        if ((dVar3 == vVar11) && (!NAN(dVar3) && !NAN(vVar11))) {
          pvVar8 = operator[]((factor *)&Ftmp.c_,local_140);
          pdVar9 = std::min<double>(&gap2,pvVar8);
          gap2 = *pdVar9;
        }
      }
      else {
        pvVar8 = operator[]((factor *)&Ftmp.c_,local_140);
        gap2 = *pvVar8;
        gap1 = operator[](F2,local_140);
      }
    }
    dStack_10 = (mx2 - gap2) + (gap1 - (double)i);
    goto LAB_00220028;
  default:
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Invalid distance type");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  dStack_10 = Z;
LAB_00220028:
  ~factor((factor *)local_e8);
  ~factor((factor *)&Ftmp.c_);
  return dStack_10;
}

Assistant:

double distance(factor const& F2, Distance type = Distance::L2) const {
		assert(vars() == F2.vars());
		factor F(*this), Ftmp;               // make a copy for manipulation
		double dist = -1.0;                   // local variables
		value Z;
		switch (type) {
		case Distance::L2:                // L2, sum of squared errors
			F -= F2;
			F *= F;
			dist = F.sum();
			break;
		case Distance::L1:               // L1, sum of absolute errors  (=TV !!)
			F -= F2;
			dist = F.abs().sum();
			break;
		case Distance::LInf:              // L-infinity, max absolute error
			F -= F2;
			dist = F.abs().max();
			break;
		case Distance::KL:                // KL-divergence (relative entropy)
			Z = sum();
			F /= F2;
			F *= F2.sum() / Z;
			F.log();
			F *= *this;
			dist = F.sum() / Z;
			break;
		case Distance::HPM:               // Hilbert's projective metric
			F /= F2;
			F.log();
			dist = F.max() - F.min(); //   aka "dynamic range"
			break;
		case Distance::MAS:               // "MAS" error value (not a metric)
			F.log();
			Ftmp = F2;
			F /= Ftmp.log();
			dist = std::max(F.max(), 1.0 / F.min()) - 1.0;
			break;
		case Distance::OptGap:            // "Primal/Dual Gap"-like
			double mx1, mx2, gap1, gap2;
			mx1 = mx2 = gap1 = gap2 = 0.0;
			for (size_t i = 0; i < num_states(); ++i) {
				if (mx1 < F[i]) {
					gap2 = F2[i];
					mx1 = F[i];
				} else if (mx1 == F[i])
					gap2 = std::min(gap2, F2[i]);
				if (mx2 < F2[i]) {
					gap1 = F[i];
					mx2 = F2[i];
				} else if (mx2 == F2[i])
					gap1 = std::min(gap1, F[i]);
			}
			return (mx1 - gap1) + (mx2 - gap2);
			break;
			//case Distance::Hellinger:   (!!)
			//  F^=0.5; F-=F2^0.5; F*=F; dist=(0.5*F.sum())^0.5;  // straightforward computation
			//  F*=F2; F^=0.5; dist=(1-F.sum())^0.5;              // alternate computation if F,F2 normalized
			//	break;
		default:
			throw std::runtime_error("Invalid distance type");
		}
		return dist;
	}